

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O1

void __thiscall ArmParser::parseSign(ArmParser *this,Parser *parser,bool *dest)

{
  Token *pTVar1;
  
  pTVar1 = Tokenizer::peekToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (pTVar1->type == Minus) {
    *dest = false;
  }
  else {
    if (pTVar1->type != Plus) {
      *dest = true;
      return;
    }
    *dest = true;
  }
  Tokenizer::eatTokens
            ((parser->entries).
             super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].tokenizer,1);
  return;
}

Assistant:

void ArmParser::parseSign(Parser& parser, bool& dest)
{
	switch (parser.peekToken().type)
	{
	case TokenType::Plus:
		dest = true;
		parser.eatToken();
		break;
	case TokenType::Minus:
		dest = false;
		parser.eatToken();
		break;
	default:
		dest = true;
		break;
	}
}